

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O0

Source_File * get_source_file(char *filename,char **where_to_search)

{
  char **ppcVar1;
  char *__filename;
  FILE *in_00;
  Source_Name *name_00;
  Source_File *pSVar2;
  Source_File *file;
  Source_Name *name;
  char is_directory;
  char *temp_name;
  FILE *in;
  char **where_to_search_local;
  char *filename_local;
  
  if (where_to_search == (char **)0x0) {
    __assert_fail("where_to_search!=NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/program/program.c"
                  ,99,"struct Source_File *get_source_file(char *, char **)");
  }
  in = (FILE *)where_to_search;
  if (*where_to_search != (char *)0x0) {
    do {
      __filename = gstr_append(*(char **)in,filename);
      in_00 = fopen(__filename,"r");
      free(__filename);
      if (in_00 != (FILE *)0x0) {
        name_00 = get_source_name(filename,*(char **)in);
        pSVar2 = extract_source_file((FILE *)in_00,name_00);
        if (pSVar2 != (Source_File *)0x0) {
          return pSVar2;
        }
        delete_source_name(name_00);
      }
      ppcVar1 = &in->_IO_read_ptr;
      in = (FILE *)&in->_IO_read_ptr;
    } while (*ppcVar1 != (char *)0x0);
    return (Source_File *)0x0;
  }
  __assert_fail("*where_to_search!=NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/program/program.c"
                ,100,"struct Source_File *get_source_file(char *, char **)");
}

Assistant:

struct Source_File* get_source_file(char *filename,char **where_to_search)
{
	FILE *in;
	char *temp_name;
	char is_directory=0;
	struct Source_Name *name;
	struct Source_File *file;

	assert(where_to_search!=NULL);
	assert(*where_to_search!=NULL);
	do
	{
		temp_name=gstr_append(*where_to_search,filename);
		in=fopen(temp_name,"r");
		free(temp_name);
		if(in==NULL)
			continue;

		name=get_source_name(filename,*where_to_search);
		file=extract_source_file(in,name);
		if(file!=NULL)
		{
			return file;
		}else
		{
			delete_source_name(name);
		}
	}while(*(++where_to_search));
	return NULL;
}